

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void sysbvm_environment_setNewBinding
               (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t binding)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t symbol;
  sysbvm_tuple_t existentBinding;
  sysbvm_environment_t *environmentObject;
  sysbvm_tuple_t binding_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  environmentObject = (sysbvm_environment_t *)binding;
  binding_local = environment;
  environment_local = (sysbvm_tuple_t)context;
  _Var1 = sysbvm_tuple_isNonNullPointer(environment);
  if (_Var1) {
    existentBinding = binding_local;
    symbol = 0;
    sVar2 = sysbvm_association_getKey((sysbvm_tuple_t)environmentObject);
    if ((*(long *)(existentBinding + 0x40) != 0) &&
       (_Var1 = sysbvm_identityDictionary_findAssociation
                          (*(sysbvm_tuple_t *)(existentBinding + 0x40),sVar2,&symbol), _Var1)) {
      sysbvm_error("Overriding existent symbol binding.");
    }
    if (*(long *)(existentBinding + 0x40) == 0) {
      sVar2 = sysbvm_identityDictionary_create((sysbvm_context_t *)environment_local);
      *(sysbvm_tuple_t *)(existentBinding + 0x40) = sVar2;
    }
    sysbvm_identityDictionary_add
              ((sysbvm_context_t *)environment_local,*(sysbvm_tuple_t *)(existentBinding + 0x40),
               (sysbvm_tuple_t)environmentObject);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_environment_setNewBinding(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t binding)
{
    if(!sysbvm_tuple_isNonNullPointer(environment))
        return;

    sysbvm_environment_t *environmentObject = (sysbvm_environment_t*)environment;
    sysbvm_tuple_t existentBinding = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t symbol = sysbvm_association_getKey(binding);

    if(environmentObject->symbolTable && sysbvm_identityDictionary_findAssociation(environmentObject->symbolTable, symbol, &existentBinding))
        sysbvm_error("Overriding existent symbol binding.");

    if(!environmentObject->symbolTable)
        environmentObject->symbolTable = sysbvm_identityDictionary_create(context);

    sysbvm_identityDictionary_add(context, environmentObject->symbolTable, binding);
}